

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_temporal_filter_avx2.c
# Opt level: O3

void av1_highbd_apply_temporal_filter_avx2
               (YV12_BUFFER_CONFIG *frame_to_filter,MACROBLOCKD *mbd,BLOCK_SIZE block_size,
               int mb_row,int mb_col,int num_planes,double *noise_levels,MV *subblock_mvs,
               int *subblock_mses,int q_factor,int filter_strength,int tf_wgt_calc_lvl,uint8_t *pred
               ,uint32_t *accum,uint16_t *count)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  uint8_t *puVar5;
  byte bVar6;
  byte bVar7;
  char cVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  byte bVar36;
  byte bVar37;
  uint uVar38;
  uint uVar39;
  ulong uVar41;
  long lVar42;
  undefined7 in_register_00000011;
  ulong uVar43;
  long lVar44;
  undefined1 (*pauVar45) [32];
  undefined1 (*pauVar46) [32];
  int iVar47;
  undefined1 (*pauVar48) [16];
  int *piVar49;
  int iVar50;
  undefined1 (*pauVar51) [16];
  undefined1 *puVar52;
  undefined1 (*pauVar53) [32];
  ulong uVar54;
  ulong uVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  uint uVar59;
  uint uVar60;
  bool bVar61;
  double dVar62;
  double dVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [64];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [12];
  undefined1 auVar92 [32];
  __m256i vsrc [5];
  double subblock_mses_scaled [4];
  uint32_t frame_sse [1152];
  uint32_t acc_5x5_sse [32] [32];
  uint32_t luma_sse_sum [1024];
  ulong local_3440;
  int local_3414;
  undefined8 local_33e0 [7];
  undefined8 uStack_33a8;
  undefined8 local_33a0 [8];
  undefined1 local_3360 [32];
  ulong local_3340;
  macroblockd_plane *local_3338;
  long local_3330;
  YV12_BUFFER_CONFIG *local_3328;
  ulong local_3320;
  uint16_t *local_3318;
  uint32_t *local_3310;
  ulong local_3308;
  ulong local_3300;
  ulong local_32f8;
  uint16_t *local_32f0;
  uint32_t *local_32e8;
  undefined1 local_32e0 [16];
  undefined1 local_32d0 [16];
  undefined1 local_32c0 [32];
  double local_32a0 [4];
  undefined1 local_3280 [16];
  double dStack_3270;
  double dStack_3268;
  int local_3260 [2];
  undefined1 auStack_3258 [32];
  undefined1 auStack_3238 [32];
  undefined1 auStack_3218 [32];
  undefined1 auStack_31f8 [4504];
  undefined1 local_2060 [16];
  undefined1 local_2050 [4080];
  int local_1060 [1036];
  ulong uVar40;
  
  uVar55 = CONCAT71(in_register_00000011,block_size) & 0xffffffff;
  bVar1 = block_size_high[uVar55];
  bVar2 = block_size_wide[uVar55];
  iVar47 = (frame_to_filter->field_2).field_0.y_crop_width;
  iVar58 = (frame_to_filter->field_3).field_0.y_crop_height;
  local_3328 = frame_to_filter;
  memset(local_3260,0,0x1200);
  memset(local_1060,0,0x1000);
  if (iVar58 < iVar47) {
    iVar47 = iVar58;
  }
  if (q_factor < 0x80) {
    dVar62 = (double)q_factor / 20.0;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = dVar62 * dVar62;
    auVar71 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar64);
    auVar64 = vcmpsd_avx(auVar64,ZEXT816(0x3ee4f8b588e368f1),1);
    local_32e0 = vblendvpd_avx(auVar71,ZEXT816(0x3ee4f8b588e368f1),auVar64);
  }
  else {
    dVar62 = (double)q_factor * 0.015625;
    local_32e0._8_8_ = 0;
    local_32e0._0_8_ = dVar62 * dVar62 * 0.5;
  }
  if (0 < num_planes) {
    auVar64 = vpshufb_avx(*(undefined1 (*) [16])subblock_mvs,_DAT_00bef490);
    auVar71 = vpshufb_avx(*(undefined1 (*) [16])subblock_mvs,_DAT_00d9a490);
    auVar64 = vpmovsxwd_avx(auVar64);
    auVar71 = vpmovsxwd_avx(auVar71);
    auVar92 = vcvtdq2pd_avx(auVar64);
    auVar78 = vcvtdq2pd_avx(auVar71);
    auVar67._0_8_ = auVar92._0_8_ * auVar92._0_8_ + auVar78._0_8_ * auVar78._0_8_;
    auVar67._8_8_ = auVar92._8_8_ * auVar92._8_8_ + auVar78._8_8_ * auVar78._8_8_;
    auVar67._16_8_ = auVar92._16_8_ * auVar92._16_8_ + auVar78._16_8_ * auVar78._16_8_;
    auVar67._24_8_ = auVar92._24_8_ * auVar92._24_8_ + auVar78._24_8_ * auVar78._24_8_;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = (double)iVar47 * 0.1;
    auVar64 = vmaxsd_avx(auVar71,ZEXT816(0x3ff0000000000000));
    auVar92 = vsqrtpd_avx(auVar67);
    auVar78._0_8_ = auVar64._0_8_;
    auVar78._8_8_ = auVar78._0_8_;
    auVar78._16_8_ = auVar78._0_8_;
    auVar78._24_8_ = auVar78._0_8_;
    auVar92 = vdivpd_avx(auVar92,auVar78);
    auVar68._8_8_ = 0;
    auVar68._0_8_ = (double)filter_strength * 0.25 * (double)filter_strength * 0.25;
    auVar71 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar68);
    auVar84._8_8_ = 0x3ff0000000000000;
    auVar84._0_8_ = 0x3ff0000000000000;
    auVar84._16_8_ = 0x3ff0000000000000;
    auVar84._24_8_ = 0x3ff0000000000000;
    _local_3280 = vmaxpd_avx(auVar92,auVar84);
    local_3330 = (long)pred * 2;
    auVar64 = vcmpsd_avx(auVar68,ZEXT816(0x3ee4f8b588e368f1),1);
    local_32d0 = vblendvpd_avx(auVar71,ZEXT816(0x3ee4f8b588e368f1),auVar64);
    local_3338 = mbd->plane;
    uVar55 = 0;
    local_3414 = 0;
    local_3340 = (ulong)(uint)num_planes;
    do {
      bVar36 = bVar1 >> ((byte)local_3338[uVar55].subsampling_y & 0x1f);
      uVar38 = (uint)bVar36;
      uVar40 = (ulong)uVar38;
      bVar37 = bVar2 >> ((byte)local_3338[uVar55].subsampling_x & 0x1f);
      uVar41 = (ulong)bVar37;
      iVar58 = local_3338[uVar55].subsampling_x - mbd->plane[0].subsampling_x;
      iVar47 = local_3338[uVar55].subsampling_y - mbd->plane[0].subsampling_y;
      bVar6 = (byte)iVar47;
      bVar7 = (byte)iVar58;
      dVar62 = 0.04;
      if (uVar55 != 0) {
        dVar62 = 1.0 / (double)((1 << (bVar6 + bVar7 & 0x1f)) + 0x19);
      }
      uVar4 = *(uint *)((long)local_3328->store_buf_adr + (ulong)(uVar55 != 0) * 4 + -0x28);
      puVar5 = local_3328->store_buf_adr[uVar55 - 4];
      dVar63 = log(noise_levels[uVar55] + noise_levels[uVar55] + 5.0);
      if ((uVar55 == 1) && (uVar38 != 0)) {
        uVar39 = 1 << (bVar6 & 0x1f);
        uVar59 = 1 << (bVar7 & 0x1f);
        if ((int)uVar59 < 2) {
          uVar59 = 1;
        }
        if ((int)uVar39 < 2) {
          uVar39 = 1;
        }
        local_3440 = 0;
        do {
          if (bVar37 != 0) {
            uVar54 = 0;
            do {
              if (iVar47 != 0x1f) {
                iVar56 = ((int)uVar54 << (bVar7 & 0x1f)) +
                         ((int)local_3440 << (bVar6 & 0x1f)) * 0x24 + 2;
                lVar42 = uVar54 + local_3440 * 0x20;
                uVar60 = 0;
                do {
                  if (iVar58 != 0x1f) {
                    iVar57 = local_1060[lVar42];
                    uVar43 = (ulong)uVar59;
                    iVar50 = iVar56;
                    do {
                      iVar57 = iVar57 + local_3260[iVar50];
                      iVar50 = iVar50 + 1;
                      uVar43 = uVar43 - 1;
                    } while (uVar43 != 0);
                    local_1060[lVar42] = iVar57;
                  }
                  uVar60 = uVar60 + 1;
                  iVar56 = iVar56 + 0x24;
                } while (uVar60 != uVar39);
              }
              uVar54 = uVar54 + 1;
            } while (uVar54 != uVar41);
          }
          local_3440 = local_3440 + 1;
        } while (local_3440 != uVar40);
      }
      uVar59 = (uint)bVar37;
      lVar44 = (long)(int)(uVar59 * mb_col + uVar4 * uVar38 * mb_row);
      lVar42 = (long)local_3414;
      pauVar53 = (undefined1 (*) [32])(local_3330 + lVar42 * 2);
      iVar47 = mbd->bd;
      if (uVar59 == 0x20) {
        if (uVar38 != 0) {
          pauVar45 = (undefined1 (*) [32])((long)puVar5 * 2 + lVar44 * 2 + 0x20);
          lVar44 = 0;
          pauVar46 = pauVar53;
          do {
            auVar92 = vpsubw_avx2(pauVar45[-1],*pauVar46);
            auVar78 = vpmullw_avx2(auVar92,auVar92);
            auVar92 = vpmulhw_avx2(auVar92,auVar92);
            auVar67 = vpunpcklwd_avx2(auVar78,auVar92);
            auVar92 = vpunpckhwd_avx2(auVar78,auVar92);
            auVar79._0_16_ = ZEXT116(0) * auVar92._0_16_ + ZEXT116(1) * auVar67._0_16_;
            auVar79._16_16_ = ZEXT116(0) * auVar67._16_16_ + ZEXT116(1) * auVar92._0_16_;
            auVar92 = vperm2i128_avx2(auVar67,auVar92,0x31);
            *(undefined1 (*) [32])(auStack_3258 + lVar44) = auVar79;
            *(undefined1 (*) [32])(auStack_3238 + lVar44) = auVar92;
            auVar92 = vpsubw_avx2(*pauVar45,pauVar46[1]);
            auVar78 = vpmullw_avx2(auVar92,auVar92);
            auVar92 = vpmulhw_avx2(auVar92,auVar92);
            auVar67 = vpunpcklwd_avx2(auVar78,auVar92);
            auVar92 = vpunpckhwd_avx2(auVar78,auVar92);
            auVar80._0_16_ = ZEXT116(0) * auVar92._0_16_ + ZEXT116(1) * auVar67._0_16_;
            auVar80._16_16_ = ZEXT116(0) * auVar67._16_16_ + ZEXT116(1) * auVar92._0_16_;
            auVar92 = vperm2i128_avx2(auVar67,auVar92,0x31);
            *(undefined1 (*) [32])(auStack_3218 + lVar44) = auVar80;
            *(undefined1 (*) [32])(auStack_31f8 + lVar44) = auVar92;
            pauVar45 = (undefined1 (*) [32])(*pauVar45 + (ulong)uVar4 * 2);
            lVar44 = lVar44 + 0x90;
            pauVar46 = pauVar46 + 2;
          } while (uVar38 * 0x90 != (int)lVar44);
        }
      }
      else if (uVar38 != 0) {
        pauVar46 = (undefined1 (*) [32])(lVar44 * 2 + (long)puVar5 * 2);
        lVar44 = 0;
        pauVar45 = pauVar53;
        do {
          auVar92 = vpsubw_avx2(*pauVar46,*pauVar45);
          auVar78 = vpmullw_avx2(auVar92,auVar92);
          auVar92 = vpmulhw_avx2(auVar92,auVar92);
          auVar67 = vpunpcklwd_avx2(auVar78,auVar92);
          auVar92 = vpunpckhwd_avx2(auVar78,auVar92);
          auVar81._0_16_ = ZEXT116(0) * auVar92._0_16_ + ZEXT116(1) * auVar67._0_16_;
          auVar81._16_16_ = ZEXT116(0) * auVar67._16_16_ + ZEXT116(1) * auVar92._0_16_;
          auVar92 = vperm2i128_avx2(auVar67,auVar92,0x31);
          *(undefined1 (*) [32])(auStack_3258 + lVar44) = auVar81;
          *(undefined1 (*) [32])(auStack_3238 + lVar44) = auVar92;
          pauVar46 = (undefined1 (*) [32])(*pauVar46 + (ulong)uVar4 * 2);
          pauVar45 = (undefined1 (*) [32])(*pauVar45 + uVar59 * 2);
          lVar44 = lVar44 + 0x90;
        } while (uVar38 * 0x90 != (int)lVar44);
      }
      dVar63 = 1.0 / ((dVar63 + 0.5) * (double)local_32e0._0_8_ * (double)local_32d0._0_8_);
      lVar44 = 0x40;
      pauVar46 = (undefined1 (*) [32])local_3260;
      do {
        auVar64 = vpermilps_avx(*(undefined1 (*) [16])*pauVar46,0xea);
        auVar92 = vblendpd_avx(ZEXT1632(auVar64),*pauVar46,0xc);
        *(undefined1 (*) [32])((long)local_33e0 + lVar44) = auVar92;
        pauVar46 = (undefined1 (*) [32])(pauVar46[4] + 0x10);
        lVar44 = lVar44 + 0x20;
      } while (lVar44 != 0xa0);
      local_33e0[0] = local_33a0[0];
      local_33e0[1] = local_33a0[1];
      local_33e0[2] = local_33a0[2];
      local_33e0[3] = local_33a0[3];
      local_33e0[4] = local_33a0[0];
      local_33e0[5] = local_33a0[1];
      local_33e0[6] = local_33a0[2];
      uStack_33a8 = local_33a0[3];
      uVar54 = (ulong)(uVar38 - 3);
      auVar91 = SUB6412(ZEXT864(0),4);
      auVar64 = SUB6416(ZEXT864(0),0);
      auVar92 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      if (3 < uVar38) {
        pauVar51 = &local_2060;
        lVar44 = 0;
        do {
          auVar12._8_8_ = local_33e0[1];
          auVar12._0_8_ = local_33e0[0];
          auVar12._16_8_ = local_33e0[2];
          auVar12._24_8_ = local_33e0[3];
          auVar78 = vpaddd_avx2(local_3360,auVar12);
          auVar18._8_8_ = local_33e0[5];
          auVar18._0_8_ = local_33e0[4];
          auVar18._16_8_ = local_33e0[6];
          auVar18._24_8_ = uStack_33a8;
          auVar78 = vpaddd_avx2(auVar78,auVar18);
          auVar24._8_8_ = local_33a0[1];
          auVar24._0_8_ = local_33a0[0];
          auVar24._16_8_ = local_33a0[2];
          auVar24._24_8_ = local_33a0[3];
          auVar78 = vpaddd_avx2(auVar78,auVar24);
          auVar30._8_8_ = local_33a0[5];
          auVar30._0_8_ = local_33a0[4];
          auVar30._16_8_ = local_33a0[6];
          auVar30._24_8_ = local_33a0[7];
          auVar78 = vpaddd_avx2(auVar78,auVar30);
          local_33e0[0] = local_33e0[4];
          local_33e0[1] = local_33e0[5];
          local_33e0[2] = local_33e0[6];
          local_33e0[3] = uStack_33a8;
          local_33e0[4] = local_33a0[0];
          local_33e0[5] = local_33a0[1];
          local_33e0[6] = local_33a0[2];
          uStack_33a8 = local_33a0[3];
          local_33a0[0] = local_33a0[4];
          local_33a0[1] = local_33a0[5];
          local_33a0[2] = local_33a0[6];
          local_33a0[3] = local_33a0[7];
          auVar71 = vpshufd_avx(*(undefined1 (*) [16])(*pauVar46 + lVar44),0xea);
          local_33a0[4] = local_3360._0_8_;
          local_33a0[5] = local_3360._8_8_;
          local_33a0[6] = local_3360._16_8_;
          local_33a0[7] = local_3360._24_8_;
          local_3360 = vpblendd_avx2(ZEXT1632(auVar71),*(undefined1 (*) [32])(*pauVar46 + lVar44),
                                     0xf0);
          auVar83._4_12_ = auVar91;
          auVar83._0_4_ = auVar78._16_4_;
          auVar71 = vpaddd_avx(auVar78._0_16_,auVar83);
          auVar68 = vpshufd_avx(auVar71,0xee);
          auVar71 = vpaddd_avx(auVar71,auVar68);
          auVar67 = vpblendd_avx2(auVar78,auVar92,0xc1);
          auVar68 = vpaddd_avx(auVar67._0_16_,auVar67._16_16_);
          auVar87 = vpsrldq_avx(auVar68,8);
          auVar68 = vpaddd_avx(auVar68,auVar87);
          auVar68 = vphaddd_avx(auVar71,auVar68);
          auVar67 = vpblendd_avx2(auVar78,auVar92,0x83);
          auVar71 = vpaddd_avx(auVar67._0_16_,auVar67._16_16_);
          auVar87 = vpsrldq_avx(auVar71,8);
          auVar71 = vpaddd_avx(auVar71,auVar87);
          auVar87 = vphaddd_avx(auVar71,auVar71);
          auVar71 = vblendps_avx(auVar64,auVar78._0_16_,8);
          auVar71 = vpaddd_avx(auVar71,auVar78._16_16_);
          auVar83 = vpsrldq_avx(auVar71,8);
          auVar71 = vpaddd_avx(auVar71,auVar83);
          auVar71 = vphaddd_avx(auVar71,auVar71);
          auVar68 = vpshufd_avx(auVar68,0xe8);
          auVar68 = vpunpcklqdq_avx(auVar68,auVar87);
          auVar87._0_4_ = auVar71._0_4_;
          auVar87._4_4_ = auVar87._0_4_;
          auVar87._8_4_ = auVar87._0_4_;
          auVar87._12_4_ = auVar87._0_4_;
          auVar71 = vpblendd_avx2(auVar68,auVar87,8);
          *pauVar51 = auVar71;
          lVar44 = lVar44 + 0x90;
          pauVar51 = pauVar51 + 8;
        } while (uVar54 * 0x90 != lVar44);
      }
      lVar44 = -0x180;
      do {
        auVar13._8_8_ = local_33e0[1];
        auVar13._0_8_ = local_33e0[0];
        auVar13._16_8_ = local_33e0[2];
        auVar13._24_8_ = local_33e0[3];
        auVar78 = vpaddd_avx2(local_3360,auVar13);
        auVar19._8_8_ = local_33e0[5];
        auVar19._0_8_ = local_33e0[4];
        auVar19._16_8_ = local_33e0[6];
        auVar19._24_8_ = uStack_33a8;
        auVar78 = vpaddd_avx2(auVar78,auVar19);
        auVar25._8_8_ = local_33a0[1];
        auVar25._0_8_ = local_33a0[0];
        auVar25._16_8_ = local_33a0[2];
        auVar25._24_8_ = local_33a0[3];
        auVar78 = vpaddd_avx2(auVar78,auVar25);
        auVar31._8_8_ = local_33a0[5];
        auVar31._0_8_ = local_33a0[4];
        auVar31._16_8_ = local_33a0[6];
        auVar31._24_8_ = local_33a0[7];
        auVar78 = vpaddd_avx2(auVar78,auVar31);
        local_33e0[0] = local_33e0[4];
        local_33e0[1] = local_33e0[5];
        local_33e0[2] = local_33e0[6];
        local_33e0[3] = uStack_33a8;
        auVar88._4_12_ = auVar91;
        auVar88._0_4_ = auVar78._16_4_;
        auVar71 = vpaddd_avx(auVar78._0_16_,auVar88);
        auVar68 = vpshufd_avx(auVar71,0xee);
        auVar71 = vpaddd_avx(auVar68,auVar71);
        auVar67 = vpblendd_avx2(auVar78,auVar92,0xc1);
        auVar68 = vpaddd_avx(auVar67._0_16_,auVar67._16_16_);
        auVar87 = vpsrldq_avx(auVar68,8);
        auVar68 = vpaddd_avx(auVar68,auVar87);
        auVar68 = vphaddd_avx(auVar71,auVar68);
        auVar67 = vpblendd_avx2(auVar78,auVar92,0x83);
        auVar71 = vpaddd_avx(auVar67._0_16_,auVar67._16_16_);
        auVar87 = vpsrldq_avx(auVar71,8);
        auVar71 = vpaddd_avx(auVar71,auVar87);
        auVar87 = vphaddd_avx(auVar71,auVar71);
        local_33e0[4] = local_33a0[0];
        local_33e0[5] = local_33a0[1];
        local_33e0[6] = local_33a0[2];
        uStack_33a8 = local_33a0[3];
        auVar71 = vblendps_avx(auVar64,auVar78._0_16_,8);
        auVar71 = vpaddd_avx(auVar71,auVar78._16_16_);
        auVar83 = vpsrldq_avx(auVar71,8);
        auVar71 = vpaddd_avx(auVar71,auVar83);
        auVar71 = vphaddd_avx(auVar71,auVar71);
        local_33a0[0] = local_33a0[4];
        local_33a0[1] = local_33a0[5];
        local_33a0[2] = local_33a0[6];
        local_33a0[3] = local_33a0[7];
        local_33a0[4] = local_3360._0_8_;
        local_33a0[5] = local_3360._8_8_;
        local_33a0[6] = local_3360._16_8_;
        local_33a0[7] = local_3360._24_8_;
        auVar68 = vpshufd_avx(auVar68,0xe8);
        auVar68 = vpunpcklqdq_avx(auVar68,auVar87);
        auVar72._0_4_ = auVar71._0_4_;
        auVar72._4_4_ = auVar72._0_4_;
        auVar72._8_4_ = auVar72._0_4_;
        auVar72._12_4_ = auVar72._0_4_;
        auVar71 = vpblendd_avx2(auVar68,auVar72,8);
        *(undefined1 (*) [16])(local_2060 + lVar44 + (ulong)bVar36 * 0x80) = auVar71;
        lVar44 = lVar44 + 0x80;
      } while (lVar44 != 0);
      uVar43 = 4;
      if (8 < uVar59) {
        puVar52 = local_2060 + (ulong)bVar36 * 0x80;
        uVar43 = 4;
        pauVar51 = (undefined1 (*) [16])local_2050;
        do {
          piVar49 = local_3260 + uVar43;
          lVar44 = 0x40;
          do {
            uVar9 = *(undefined8 *)(piVar49 + 2);
            uVar10 = *(undefined8 *)(piVar49 + 4);
            uVar11 = *(undefined8 *)(piVar49 + 6);
            *(undefined8 *)((long)local_33e0 + lVar44) = *(undefined8 *)piVar49;
            *(undefined8 *)((long)local_33e0 + lVar44 + 8) = uVar9;
            *(undefined8 *)((long)local_33e0 + lVar44 + 0x10) = uVar10;
            *(undefined8 *)((long)local_33e0 + lVar44 + 0x18) = uVar11;
            piVar49 = piVar49 + 0x24;
            lVar44 = lVar44 + 0x20;
          } while (lVar44 != 0xa0);
          local_33e0[0] = local_33a0[0];
          local_33e0[1] = local_33a0[1];
          local_33e0[2] = local_33a0[2];
          local_33e0[3] = local_33a0[3];
          local_33e0[4] = local_33a0[0];
          local_33e0[5] = local_33a0[1];
          local_33e0[6] = local_33a0[2];
          uStack_33a8 = local_33a0[3];
          if (3 < uVar38) {
            lVar44 = 0;
            pauVar48 = pauVar51;
            do {
              auVar14._8_8_ = local_33e0[1];
              auVar14._0_8_ = local_33e0[0];
              auVar14._16_8_ = local_33e0[2];
              auVar14._24_8_ = local_33e0[3];
              auVar78 = vpaddd_avx2(local_3360,auVar14);
              auVar20._8_8_ = local_33e0[5];
              auVar20._0_8_ = local_33e0[4];
              auVar20._16_8_ = local_33e0[6];
              auVar20._24_8_ = uStack_33a8;
              auVar78 = vpaddd_avx2(auVar78,auVar20);
              auVar26._8_8_ = local_33a0[1];
              auVar26._0_8_ = local_33a0[0];
              auVar26._16_8_ = local_33a0[2];
              auVar26._24_8_ = local_33a0[3];
              auVar78 = vpaddd_avx2(auVar78,auVar26);
              auVar32._8_8_ = local_33a0[5];
              auVar32._0_8_ = local_33a0[4];
              auVar32._16_8_ = local_33a0[6];
              auVar32._24_8_ = local_33a0[7];
              auVar78 = vpaddd_avx2(auVar78,auVar32);
              local_33e0[0] = local_33e0[4];
              local_33e0[1] = local_33e0[5];
              local_33e0[2] = local_33e0[6];
              local_33e0[3] = uStack_33a8;
              local_33e0[4] = local_33a0[0];
              local_33e0[5] = local_33a0[1];
              local_33e0[6] = local_33a0[2];
              uStack_33a8 = local_33a0[3];
              local_33a0[0] = local_33a0[4];
              local_33a0[1] = local_33a0[5];
              local_33a0[2] = local_33a0[6];
              local_33a0[3] = local_33a0[7];
              local_33a0[4] = local_3360._0_8_;
              local_33a0[5] = local_3360._8_8_;
              local_33a0[6] = local_3360._16_8_;
              local_33a0[7] = local_3360._24_8_;
              local_3360 = *(undefined1 (*) [32])((long)piVar49 + lVar44);
              auVar85._4_12_ = auVar91;
              auVar85._0_4_ = auVar78._16_4_;
              auVar71 = vpaddd_avx(auVar78._0_16_,auVar85);
              auVar68 = vpshufd_avx(auVar71,0xee);
              auVar71 = vpaddd_avx(auVar71,auVar68);
              auVar67 = vpblendd_avx2(auVar78,auVar92,0xc1);
              auVar68 = vpaddd_avx(auVar67._0_16_,auVar67._16_16_);
              auVar87 = vpsrldq_avx(auVar68,8);
              auVar68 = vpaddd_avx(auVar68,auVar87);
              auVar68 = vphaddd_avx(auVar71,auVar68);
              auVar67 = vpblendd_avx2(auVar78,auVar92,0x83);
              auVar71 = vpaddd_avx(auVar67._0_16_,auVar67._16_16_);
              auVar87 = vpsrldq_avx(auVar71,8);
              auVar71 = vpaddd_avx(auVar71,auVar87);
              auVar87 = vphaddd_avx(auVar71,auVar71);
              auVar71 = vblendps_avx(auVar64,auVar78._0_16_,8);
              auVar71 = vpaddd_avx(auVar71,auVar78._16_16_);
              auVar83 = vpsrldq_avx(auVar71,8);
              auVar71 = vpaddd_avx(auVar71,auVar83);
              auVar71 = vphaddd_avx(auVar71,auVar71);
              auVar68 = vpshufd_avx(auVar68,0xe8);
              auVar68 = vpunpcklqdq_avx(auVar68,auVar87);
              auVar73._0_4_ = auVar71._0_4_;
              auVar73._4_4_ = auVar73._0_4_;
              auVar73._8_4_ = auVar73._0_4_;
              auVar73._12_4_ = auVar73._0_4_;
              auVar71 = vpblendd_avx2(auVar68,auVar73,8);
              *pauVar48 = auVar71;
              lVar44 = lVar44 + 0x90;
              pauVar48 = pauVar48 + 8;
            } while (uVar54 * 0x90 != lVar44);
          }
          lVar44 = -0x180;
          do {
            auVar15._8_8_ = local_33e0[1];
            auVar15._0_8_ = local_33e0[0];
            auVar15._16_8_ = local_33e0[2];
            auVar15._24_8_ = local_33e0[3];
            auVar78 = vpaddd_avx2(local_3360,auVar15);
            auVar21._8_8_ = local_33e0[5];
            auVar21._0_8_ = local_33e0[4];
            auVar21._16_8_ = local_33e0[6];
            auVar21._24_8_ = uStack_33a8;
            auVar78 = vpaddd_avx2(auVar78,auVar21);
            auVar27._8_8_ = local_33a0[1];
            auVar27._0_8_ = local_33a0[0];
            auVar27._16_8_ = local_33a0[2];
            auVar27._24_8_ = local_33a0[3];
            auVar78 = vpaddd_avx2(auVar78,auVar27);
            auVar33._8_8_ = local_33a0[5];
            auVar33._0_8_ = local_33a0[4];
            auVar33._16_8_ = local_33a0[6];
            auVar33._24_8_ = local_33a0[7];
            auVar78 = vpaddd_avx2(auVar78,auVar33);
            local_33e0[0] = local_33e0[4];
            local_33e0[1] = local_33e0[5];
            local_33e0[2] = local_33e0[6];
            local_33e0[3] = uStack_33a8;
            auVar89._4_12_ = auVar91;
            auVar89._0_4_ = auVar78._16_4_;
            auVar71 = vpaddd_avx(auVar78._0_16_,auVar89);
            auVar68 = vpshufd_avx(auVar71,0xee);
            auVar71 = vpaddd_avx(auVar68,auVar71);
            auVar67 = vpblendd_avx2(auVar78,auVar92,0xc1);
            auVar68 = vpaddd_avx(auVar67._0_16_,auVar67._16_16_);
            auVar87 = vpsrldq_avx(auVar68,8);
            auVar68 = vpaddd_avx(auVar68,auVar87);
            auVar68 = vphaddd_avx(auVar71,auVar68);
            auVar67 = vpblendd_avx2(auVar78,auVar92,0x83);
            auVar71 = vpaddd_avx(auVar67._0_16_,auVar67._16_16_);
            auVar87 = vpsrldq_avx(auVar71,8);
            auVar71 = vpaddd_avx(auVar71,auVar87);
            auVar87 = vphaddd_avx(auVar71,auVar71);
            local_33e0[4] = local_33a0[0];
            local_33e0[5] = local_33a0[1];
            local_33e0[6] = local_33a0[2];
            uStack_33a8 = local_33a0[3];
            auVar71 = vblendps_avx(auVar64,auVar78._0_16_,8);
            auVar71 = vpaddd_avx(auVar71,auVar78._16_16_);
            auVar83 = vpsrldq_avx(auVar71,8);
            auVar71 = vpaddd_avx(auVar71,auVar83);
            auVar71 = vphaddd_avx(auVar71,auVar71);
            local_33a0[0] = local_33a0[4];
            local_33a0[1] = local_33a0[5];
            local_33a0[2] = local_33a0[6];
            local_33a0[3] = local_33a0[7];
            local_33a0[4] = local_3360._0_8_;
            local_33a0[5] = local_3360._8_8_;
            local_33a0[6] = local_3360._16_8_;
            local_33a0[7] = local_3360._24_8_;
            auVar68 = vpshufd_avx(auVar68,0xe8);
            auVar68 = vpunpcklqdq_avx(auVar68,auVar87);
            auVar74._0_4_ = auVar71._0_4_;
            auVar74._4_4_ = auVar74._0_4_;
            auVar74._8_4_ = auVar74._0_4_;
            auVar74._12_4_ = auVar74._0_4_;
            auVar71 = vpblendd_avx2(auVar68,auVar74,8);
            *(undefined1 (*) [16])(puVar52 + lVar44 + 0x10) = auVar71;
            lVar44 = lVar44 + 0x80;
          } while (lVar44 != 0);
          uVar43 = uVar43 + 4;
          pauVar51 = pauVar51 + 1;
          puVar52 = puVar52 + 0x10;
        } while (uVar43 < uVar59 - 4);
        uVar43 = uVar43 & 0xffffffff;
      }
      pauVar46 = (undefined1 (*) [32])(local_3260 + uVar43);
      lVar44 = 0x40;
      do {
        auVar78 = *pauVar46;
        auVar67 = vshufps_avx(auVar78,auVar78,0x54);
        auVar70._0_16_ = auVar78._0_16_;
        auVar70._16_16_ = auVar67._16_16_;
        *(undefined1 (*) [32])((long)local_33e0 + lVar44) = auVar70;
        pauVar46 = (undefined1 (*) [32])(pauVar46[4] + 0x10);
        lVar44 = lVar44 + 0x20;
      } while (lVar44 != 0xa0);
      local_33e0[0] = local_33a0[0];
      local_33e0[1] = local_33a0[1];
      local_33e0[2] = local_33a0[2];
      local_33e0[3] = local_33a0[3];
      local_33e0[4] = local_33a0[0];
      local_33e0[5] = local_33a0[1];
      local_33e0[6] = local_33a0[2];
      uStack_33a8 = local_33a0[3];
      if (3 < uVar38) {
        pauVar51 = (undefined1 (*) [16])(local_2060 + uVar43 * 4);
        lVar44 = 0;
        do {
          auVar16._8_8_ = local_33e0[1];
          auVar16._0_8_ = local_33e0[0];
          auVar16._16_8_ = local_33e0[2];
          auVar16._24_8_ = local_33e0[3];
          auVar78 = vpaddd_avx2(local_3360,auVar16);
          auVar22._8_8_ = local_33e0[5];
          auVar22._0_8_ = local_33e0[4];
          auVar22._16_8_ = local_33e0[6];
          auVar22._24_8_ = uStack_33a8;
          auVar78 = vpaddd_avx2(auVar78,auVar22);
          auVar28._8_8_ = local_33a0[1];
          auVar28._0_8_ = local_33a0[0];
          auVar28._16_8_ = local_33a0[2];
          auVar28._24_8_ = local_33a0[3];
          auVar78 = vpaddd_avx2(auVar78,auVar28);
          auVar34._8_8_ = local_33a0[5];
          auVar34._0_8_ = local_33a0[4];
          auVar34._16_8_ = local_33a0[6];
          auVar34._24_8_ = local_33a0[7];
          auVar67 = vpaddd_avx2(auVar78,auVar34);
          local_33e0[0] = local_33e0[4];
          local_33e0[1] = local_33e0[5];
          local_33e0[2] = local_33e0[6];
          local_33e0[3] = uStack_33a8;
          local_33e0[4] = local_33a0[0];
          local_33e0[5] = local_33a0[1];
          local_33e0[6] = local_33a0[2];
          uStack_33a8 = local_33a0[3];
          local_33a0[0] = local_33a0[4];
          local_33a0[1] = local_33a0[5];
          local_33a0[2] = local_33a0[6];
          local_33a0[3] = local_33a0[7];
          local_33a0[4] = local_3360._0_8_;
          local_33a0[5] = local_3360._8_8_;
          local_33a0[6] = local_3360._16_8_;
          local_33a0[7] = local_3360._24_8_;
          auVar78 = *(undefined1 (*) [32])(*pauVar46 + lVar44);
          auVar84 = vpshufd_avx2(auVar78,0x54);
          local_3360._0_16_ = ZEXT116(0) * auVar84._16_16_ + ZEXT116(1) * auVar78._0_16_;
          local_3360._16_16_ = ZEXT116(0) * auVar78._16_16_ + ZEXT116(1) * auVar84._16_16_;
          auVar86._4_12_ = auVar91;
          auVar86._0_4_ = auVar67._16_4_;
          auVar71 = vpaddd_avx(auVar67._0_16_,auVar86);
          auVar68 = vpshufd_avx(auVar71,0xee);
          auVar71 = vpaddd_avx(auVar71,auVar68);
          auVar78 = vpblendd_avx2(auVar67,auVar92,0xc1);
          auVar68 = vpaddd_avx(auVar78._0_16_,auVar78._16_16_);
          auVar87 = vpsrldq_avx(auVar68,8);
          auVar68 = vpaddd_avx(auVar68,auVar87);
          auVar68 = vphaddd_avx(auVar71,auVar68);
          auVar78 = vpblendd_avx2(auVar67,auVar92,0x83);
          auVar71 = vpaddd_avx(auVar78._0_16_,auVar78._16_16_);
          auVar87 = vpsrldq_avx(auVar71,8);
          auVar71 = vpaddd_avx(auVar71,auVar87);
          auVar87 = vphaddd_avx(auVar71,auVar71);
          auVar71 = vblendps_avx(auVar64,auVar67._0_16_,8);
          auVar71 = vpaddd_avx(auVar71,auVar67._16_16_);
          auVar83 = vpsrldq_avx(auVar71,8);
          auVar71 = vpaddd_avx(auVar71,auVar83);
          auVar71 = vphaddd_avx(auVar71,auVar71);
          auVar68 = vpshufd_avx(auVar68,0xe8);
          auVar68 = vpunpcklqdq_avx(auVar68,auVar87);
          auVar75._0_4_ = auVar71._0_4_;
          auVar75._4_4_ = auVar75._0_4_;
          auVar75._8_4_ = auVar75._0_4_;
          auVar75._12_4_ = auVar75._0_4_;
          auVar71 = vpblendd_avx2(auVar68,auVar75,8);
          *pauVar51 = auVar71;
          lVar44 = lVar44 + 0x90;
          pauVar51 = pauVar51 + 8;
        } while (uVar54 * 0x90 != lVar44);
      }
      lVar44 = -0x180;
      do {
        auVar17._8_8_ = local_33e0[1];
        auVar17._0_8_ = local_33e0[0];
        auVar17._16_8_ = local_33e0[2];
        auVar17._24_8_ = local_33e0[3];
        auVar78 = vpaddd_avx2(local_3360,auVar17);
        auVar23._8_8_ = local_33e0[5];
        auVar23._0_8_ = local_33e0[4];
        auVar23._16_8_ = local_33e0[6];
        auVar23._24_8_ = uStack_33a8;
        auVar78 = vpaddd_avx2(auVar78,auVar23);
        auVar29._8_8_ = local_33a0[1];
        auVar29._0_8_ = local_33a0[0];
        auVar29._16_8_ = local_33a0[2];
        auVar29._24_8_ = local_33a0[3];
        auVar78 = vpaddd_avx2(auVar78,auVar29);
        auVar35._8_8_ = local_33a0[5];
        auVar35._0_8_ = local_33a0[4];
        auVar35._16_8_ = local_33a0[6];
        auVar35._24_8_ = local_33a0[7];
        auVar78 = vpaddd_avx2(auVar78,auVar35);
        local_33e0[0] = local_33e0[4];
        local_33e0[1] = local_33e0[5];
        local_33e0[2] = local_33e0[6];
        local_33e0[3] = uStack_33a8;
        auVar90._4_12_ = auVar91;
        auVar90._0_4_ = auVar78._16_4_;
        auVar71 = vpaddd_avx(auVar78._0_16_,auVar90);
        auVar68 = vpshufd_avx(auVar71,0xee);
        auVar71 = vpaddd_avx(auVar68,auVar71);
        auVar67 = vpblendd_avx2(auVar78,auVar92,0xc1);
        auVar68 = vpaddd_avx(auVar67._0_16_,auVar67._16_16_);
        auVar87 = vpsrldq_avx(auVar68,8);
        auVar68 = vpaddd_avx(auVar68,auVar87);
        auVar68 = vphaddd_avx(auVar71,auVar68);
        auVar67 = vpblendd_avx2(auVar78,auVar92,0x83);
        auVar71 = vpaddd_avx(auVar67._0_16_,auVar67._16_16_);
        auVar87 = vpsrldq_avx(auVar71,8);
        auVar71 = vpaddd_avx(auVar71,auVar87);
        auVar87 = vphaddd_avx(auVar71,auVar71);
        local_33e0[4] = local_33a0[0];
        local_33e0[5] = local_33a0[1];
        local_33e0[6] = local_33a0[2];
        uStack_33a8 = local_33a0[3];
        auVar71 = vblendps_avx(auVar64,auVar78._0_16_,8);
        auVar71 = vpaddd_avx(auVar71,auVar78._16_16_);
        auVar83 = vpsrldq_avx(auVar71,8);
        auVar71 = vpaddd_avx(auVar71,auVar83);
        auVar71 = vphaddd_avx(auVar71,auVar71);
        local_33a0[0] = local_33a0[4];
        local_33a0[1] = local_33a0[5];
        local_33a0[2] = local_33a0[6];
        local_33a0[3] = local_33a0[7];
        local_33a0[4] = local_3360._0_8_;
        local_33a0[5] = local_3360._8_8_;
        local_33a0[6] = local_3360._16_8_;
        local_33a0[7] = local_3360._24_8_;
        auVar68 = vpshufd_avx(auVar68,0xe8);
        auVar68 = vpunpcklqdq_avx(auVar68,auVar87);
        auVar76._0_4_ = auVar71._0_4_;
        auVar76._4_4_ = auVar76._0_4_;
        auVar76._8_4_ = auVar76._0_4_;
        auVar76._12_4_ = auVar76._0_4_;
        auVar71 = vpblendd_avx2(auVar68,auVar76,8);
        *(undefined1 (*) [16])(local_2060 + lVar44 + (ulong)bVar36 * 0x80 + uVar43 * 4) = auVar71;
        lVar44 = lVar44 + 0x80;
      } while (lVar44 != 0);
      local_32c0._0_8_ = dVar63 * (double)local_3280._0_8_;
      local_32c0._8_8_ = dVar63 * (double)local_3280._8_8_;
      local_32c0._16_8_ = dVar63 * dStack_3270;
      local_32c0._24_8_ = dVar63 * dStack_3268;
      auVar92 = vcvtdq2pd_avx(*(undefined1 (*) [16])subblock_mses);
      local_32a0[0] = auVar92._0_8_ * 0.008333333333333333;
      local_32a0[1] = auVar92._8_8_ * 0.008333333333333333;
      local_32a0[2] = auVar92._16_8_ * 0.008333333333333333;
      local_32a0[3] = auVar92._24_8_ * 0.008333333333333333;
      cVar8 = (char)iVar47;
      local_3320 = uVar55;
      if (tf_wgt_calc_lvl == 0) {
        auVar82 = ZEXT1664(ZEXT816(0x401c000000000000));
        if (uVar38 != 0) {
          local_3300 = (ulong)(bVar36 >> 1);
          local_3310 = accum + lVar42;
          local_3318 = count + lVar42;
          local_3308 = (ulong)(uVar59 * 2);
          uVar55 = 0;
          puVar52 = local_2060;
          piVar49 = local_1060;
          iVar47 = 0;
          do {
            bVar61 = local_3300 <= uVar55;
            if (uVar59 != 0) {
              local_32e8 = local_3310 + iVar47;
              local_32f0 = local_3318 + iVar47;
              uVar54 = 0;
              local_32f8 = uVar55;
              do {
                uVar55 = (ulong)(((uint)(bVar37 >> 1 <= uVar54) | (uint)bVar61 * 2) << 3);
                dVar63 = (dVar62 * (double)((uint)(piVar49[uVar54] + *(int *)(puVar52 + uVar54 * 4))
                                           >> (cVar8 * '\x02' - 0x10U & 0x1f)) *
                          0.041666666666666664 + *(double *)((long)local_32a0 + uVar55)) *
                         *(double *)(local_32c0 + uVar55);
                uVar3 = *(ushort *)(*pauVar53 + uVar54 * 2);
                auVar69._0_8_ = -dVar63;
                auVar69._8_8_ = 0x8000000000000000;
                auVar66._8_8_ = 0;
                auVar66._0_8_ = dVar63;
                auVar64 = vcmpsd_avx(auVar66,auVar82._0_16_,1);
                auVar77._8_8_ = 0xc01c000000000000;
                auVar77._0_8_ = 0xc01c000000000000;
                auVar64 = vblendvpd_avx(auVar77,auVar69,auVar64);
                dVar63 = exp(auVar64._0_8_);
                auVar82 = ZEXT1664(ZEXT816(0x401c000000000000));
                local_32f0[uVar54] = local_32f0[uVar54] + (short)(int)(dVar63 * 1000.0);
                local_32e8[uVar54] = local_32e8[uVar54] + (uint)uVar3 * (int)(dVar63 * 1000.0);
                uVar54 = uVar54 + 1;
              } while (uVar41 != uVar54);
              iVar47 = iVar47 + (int)uVar54;
              uVar55 = local_32f8;
            }
            uVar55 = uVar55 + 1;
            piVar49 = piVar49 + 0x20;
            puVar52 = puVar52 + 0x80;
            pauVar53 = (undefined1 (*) [32])(*pauVar53 + local_3308);
          } while (uVar55 != uVar40);
        }
      }
      else if (uVar38 != 0) {
        uVar55 = 0;
        puVar52 = local_2060;
        piVar49 = local_1060;
        iVar47 = 0;
        do {
          if (uVar59 != 0) {
            uVar54 = 0;
            do {
              uVar43 = (ulong)(((uint)(bVar37 >> 1 <= uVar54) | (uint)(bVar36 >> 1 <= uVar55) * 2)
                              << 3);
              auVar65._8_8_ = 0;
              auVar65._0_8_ =
                   (dVar62 * (double)((uint)(piVar49[uVar54] + *(int *)(puVar52 + uVar54 * 4)) >>
                                     (cVar8 * '\x02' - 0x10U & 0x1f)) * 0.041666666666666664 +
                   *(double *)((long)local_32a0 + uVar43)) * *(double *)(local_32c0 + uVar43);
              auVar64 = vminsd_avx(auVar65,ZEXT816(0x401c000000000000));
              iVar58 = (int)((float)((int)((float)auVar64._0_8_ * -12102203.0) + 0x3f7f127f) *
                             1000.0 + 0.5);
              uVar3 = *(ushort *)(*pauVar53 + uVar54 * 2);
              count[lVar42 + (long)iVar47 + uVar54] =
                   count[lVar42 + (long)iVar47 + uVar54] + (short)iVar58;
              accum[lVar42 + (long)iVar47 + uVar54] =
                   accum[lVar42 + (long)iVar47 + uVar54] + (uint)uVar3 * iVar58;
              uVar54 = uVar54 + 1;
            } while (uVar41 != uVar54);
            iVar47 = iVar47 + (int)uVar54;
          }
          uVar55 = uVar55 + 1;
          piVar49 = piVar49 + 0x20;
          puVar52 = puVar52 + 0x80;
          pauVar53 = (undefined1 (*) [32])(*pauVar53 + uVar59 * 2);
        } while (uVar55 != uVar40);
      }
      local_3414 = local_3414 + uVar59 * uVar38;
      uVar55 = local_3320 + 1;
    } while (uVar55 != local_3340);
  }
  return;
}

Assistant:

void av1_highbd_apply_temporal_filter_avx2(
    const YV12_BUFFER_CONFIG *frame_to_filter, const MACROBLOCKD *mbd,
    const BLOCK_SIZE block_size, const int mb_row, const int mb_col,
    const int num_planes, const double *noise_levels, const MV *subblock_mvs,
    const int *subblock_mses, const int q_factor, const int filter_strength,
    int tf_wgt_calc_lvl, const uint8_t *pred, uint32_t *accum,
    uint16_t *count) {
  const int is_high_bitdepth = frame_to_filter->flags & YV12_FLAG_HIGHBITDEPTH;
  assert(block_size == BLOCK_32X32 && "Only support 32x32 block with sse2!");
  assert(TF_WINDOW_LENGTH == 5 && "Only support window length 5 with sse2!");
  assert(num_planes >= 1 && num_planes <= MAX_MB_PLANE);
  (void)is_high_bitdepth;

  const int mb_height = block_size_high[block_size];
  const int mb_width = block_size_wide[block_size];
  const int frame_height = frame_to_filter->y_crop_height;
  const int frame_width = frame_to_filter->y_crop_width;
  const int min_frame_size = AOMMIN(frame_height, frame_width);
  // Variables to simplify combined error calculation.
  const double inv_factor = 1.0 / ((TF_WINDOW_BLOCK_BALANCE_WEIGHT + 1) *
                                   TF_SEARCH_ERROR_NORM_WEIGHT);
  const double weight_factor =
      (double)TF_WINDOW_BLOCK_BALANCE_WEIGHT * inv_factor;
  // Adjust filtering based on q.
  // Larger q -> stronger filtering -> larger weight.
  // Smaller q -> weaker filtering -> smaller weight.
  double q_decay = pow((double)q_factor / TF_Q_DECAY_THRESHOLD, 2);
  q_decay = CLIP(q_decay, 1e-5, 1);
  if (q_factor >= TF_QINDEX_CUTOFF) {
    // Max q_factor is 255, therefore the upper bound of q_decay is 8.
    // We do not need a clip here.
    q_decay = 0.5 * pow((double)q_factor / 64, 2);
  }
  // Smaller strength -> smaller filtering weight.
  double s_decay = pow((double)filter_strength / TF_STRENGTH_THRESHOLD, 2);
  s_decay = CLIP(s_decay, 1e-5, 1);
  double d_factor[4] = { 0 };
  uint32_t frame_sse[SSE_STRIDE * BH] = { 0 };
  uint32_t luma_sse_sum[BW * BH] = { 0 };
  uint16_t *pred1 = CONVERT_TO_SHORTPTR(pred);

  for (int subblock_idx = 0; subblock_idx < 4; subblock_idx++) {
    // Larger motion vector -> smaller filtering weight.
    const MV mv = subblock_mvs[subblock_idx];
    const double distance = sqrt(pow(mv.row, 2) + pow(mv.col, 2));
    double distance_threshold = min_frame_size * TF_SEARCH_DISTANCE_THRESHOLD;
    distance_threshold = AOMMAX(distance_threshold, 1);
    d_factor[subblock_idx] = distance / distance_threshold;
    d_factor[subblock_idx] = AOMMAX(d_factor[subblock_idx], 1);
  }

  // Handle planes in sequence.
  int plane_offset = 0;
  for (int plane = 0; plane < num_planes; ++plane) {
    const uint32_t plane_h = mb_height >> mbd->plane[plane].subsampling_y;
    const uint32_t plane_w = mb_width >> mbd->plane[plane].subsampling_x;
    const uint32_t frame_stride = frame_to_filter->strides[plane == 0 ? 0 : 1];
    const int frame_offset = mb_row * plane_h * frame_stride + mb_col * plane_w;

    const uint16_t *ref =
        CONVERT_TO_SHORTPTR(frame_to_filter->buffers[plane]) + frame_offset;
    const int ss_x_shift =
        mbd->plane[plane].subsampling_x - mbd->plane[AOM_PLANE_Y].subsampling_x;
    const int ss_y_shift =
        mbd->plane[plane].subsampling_y - mbd->plane[AOM_PLANE_Y].subsampling_y;
    const int num_ref_pixels = TF_WINDOW_LENGTH * TF_WINDOW_LENGTH +
                               ((plane) ? (1 << (ss_x_shift + ss_y_shift)) : 0);
    const double inv_num_ref_pixels = 1.0 / num_ref_pixels;
    // Larger noise -> larger filtering weight.
    const double n_decay = 0.5 + log(2 * noise_levels[plane] + 5.0);
    // Decay factors for non-local mean approach.
    const double decay_factor = 1 / (n_decay * q_decay * s_decay);

    // Filter U-plane and V-plane using Y-plane. This is because motion
    // search is only done on Y-plane, so the information from Y-plane
    // will be more accurate. The luma sse sum is reused in both chroma
    // planes.
    if (plane == AOM_PLANE_U) {
      for (unsigned int i = 0, k = 0; i < plane_h; i++) {
        for (unsigned int j = 0; j < plane_w; j++, k++) {
          for (int ii = 0; ii < (1 << ss_y_shift); ++ii) {
            for (int jj = 0; jj < (1 << ss_x_shift); ++jj) {
              const int yy = (i << ss_y_shift) + ii;  // Y-coord on Y-plane.
              const int xx = (j << ss_x_shift) + jj;  // X-coord on Y-plane.
              luma_sse_sum[i * BW + j] += frame_sse[yy * SSE_STRIDE + xx + 2];
            }
          }
        }
      }
    }

    highbd_apply_temporal_filter(
        ref, frame_stride, pred1 + plane_offset, plane_w, plane_w, plane_h,
        subblock_mses, accum + plane_offset, count + plane_offset, frame_sse,
        luma_sse_sum, mbd->bd, inv_num_ref_pixels, decay_factor, inv_factor,
        weight_factor, d_factor, tf_wgt_calc_lvl);
    plane_offset += plane_h * plane_w;
  }
}